

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

Var Js::JavascriptWeakMap::EntryGet(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *key_00;
  JavascriptLibrary *pJVar8;
  RecyclableObject *local_90;
  RecyclableObject *local_88;
  RecyclableObject *keyObj;
  Var value;
  RecyclableObject *pRStack_58;
  bool loaded;
  Var key;
  JavascriptWeakMap *weakMap;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                ,0xbc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  weakMap = (JavascriptWeakMap *)RecyclableObject::GetScriptContext(function);
  pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptWeakMap>(pvVar7);
  if (bVar2) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
    key = VarTo<Js::JavascriptWeakMap>(pvVar7);
    if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)weakMap);
      local_88 = JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
    }
    else {
      local_88 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    pRStack_58 = local_88;
    value._7_1_ = 0;
    keyObj = (RecyclableObject *)0x0;
    BVar3 = Js::JavascriptOperators::IsObject(local_88);
    if (BVar3 != 0) {
      key_00 = VarTo<Js::RecyclableObject>(pRStack_58);
      value._7_1_ = Get((JavascriptWeakMap *)key,key_00,&keyObj);
    }
    bVar2 = ScriptContext::IsTTDRecordOrReplayModeEnabled((ScriptContext *)weakMap);
    if (bVar2) {
      bVar2 = ScriptContext::IsTTDRecordModeEnabled((ScriptContext *)weakMap);
      if (bVar2) {
        pSVar4 = RecyclableObject::GetScriptContext(function);
        pTVar5 = ScriptContext::GetThreadContext(pSVar4);
        TTD::EventLog::RecordWeakCollectionContainsEvent(pTVar5->TTDLog,(bool)(value._7_1_ & 1));
      }
      else {
        pSVar4 = RecyclableObject::GetScriptContext(function);
        pTVar5 = ScriptContext::GetThreadContext(pSVar4);
        value._7_1_ = TTD::EventLog::ReplayWeakCollectionContainsEvent(pTVar5->TTDLog);
      }
    }
    if ((value._7_1_ & 1) == 0) {
      pJVar8 = ScriptContext::GetLibrary((ScriptContext *)weakMap);
      local_90 = JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
    }
    else {
      local_90 = (RecyclableObject *)CrossSite::MarshalVar((ScriptContext *)weakMap,keyObj,false);
    }
    return local_90;
  }
  JavascriptError::ThrowTypeErrorVar
            ((ScriptContext *)weakMap,-0x7ff5ec04,L"WeakMap.prototype.get",L"WeakMap");
}

Assistant:

Var JavascriptWeakMap::EntryGet(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakMap>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakMap.prototype.get"), _u("WeakMap"));
        }

        JavascriptWeakMap* weakMap = VarTo<JavascriptWeakMap>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();

        bool loaded = false;
        Var value = nullptr;
        if (JavascriptOperators::IsObject(key))
        {
            RecyclableObject* keyObj = VarTo<RecyclableObject>(key);
            loaded = weakMap->Get(keyObj, &value);
        }

#if ENABLE_TTD
        if(scriptContext->IsTTDRecordOrReplayModeEnabled())
        {
            if(scriptContext->IsTTDRecordModeEnabled())
            {
                function->GetScriptContext()->GetThreadContext()->TTDLog->RecordWeakCollectionContainsEvent(loaded);
            }
            else
            {
                loaded = function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayWeakCollectionContainsEvent();
            }
        }
#endif

        return loaded ? CrossSite::MarshalVar(scriptContext, value) : scriptContext->GetLibrary()->GetUndefined();
    }